

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

int Gia_ObjIsMuxType(Gia_Obj_t *pNode)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  
  if (((ulong)pNode & 1) == 0) {
    uVar2 = *(ulong *)pNode;
    uVar5 = uVar2 & 0x1fffffff;
    uVar4 = 0;
    uVar6 = 0;
    if (uVar5 != 0x1fffffff && -1 < (int)(uint)uVar2) {
      uVar7 = (uint)uVar2 & 0x1fffffff;
      uVar6 = uVar4;
      if ((((uVar2 >> 0x3d & 1) != 0) && ((uVar2 & 0x20000000) != 0)) &&
         (uVar7 == 0x1fffffff || uVar7 != ((uint)(uVar2 >> 0x20) & 0x1fffffff))) {
        uVar3 = *(ulong *)(pNode + -uVar5);
        if ((uVar3 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar3) {
          pGVar1 = pNode + -(uVar2 >> 0x20 & 0x1fffffff);
          uVar2 = *(ulong *)pGVar1;
          if ((uVar2 & 0x1fffffff) != 0x1fffffff && -1 < (int)(uint)uVar2) {
            if (((((pNode + (-uVar5 - (uVar3 & 0x1fffffff)) != pGVar1 + -(uVar2 & 0x1fffffff)) ||
                  (uVar6 = 1, (((uint)uVar2 ^ (uint)uVar3) >> 0x1d & 1) == 0)) &&
                 ((uVar4 = (uint)(uVar2 >> 0x20),
                  pNode + (-uVar5 - (uVar3 & 0x1fffffff)) != pGVar1 + -(ulong)(uVar4 & 0x1fffffff)
                  || (uVar6 = 1, ((uVar4 >> 0x1d ^ (uint)(uVar3 >> 0x1d) & 7) & 1) == 0)))) &&
                ((uVar7 = (uint)(uVar3 >> 0x20),
                 pNode + (-uVar5 - (ulong)(uVar7 & 0x1fffffff)) != pGVar1 + -(uVar2 & 0x1fffffff) ||
                 (uVar6 = 1, (((uint)(uVar2 >> 0x1d) & 7 ^ uVar7 >> 0x1d) & 1) == 0)))) &&
               (uVar6 = 0,
               pNode + (-uVar5 - (ulong)(uVar7 & 0x1fffffff)) ==
               pGVar1 + -(ulong)(uVar4 & 0x1fffffff))) {
              uVar6 = (uVar4 ^ uVar7) >> 0x1d & 1;
            }
          }
        }
      }
    }
    return uVar6;
  }
  __assert_fail("!Gia_IsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x38a,"int Gia_ObjIsMuxType(Gia_Obj_t *)");
}

Assistant:

int Gia_ObjIsMuxType( Gia_Obj_t * pNode )
{
    Gia_Obj_t * pNode0, * pNode1;
    // check that the node is regular
    assert( !Gia_IsComplement(pNode) );
    // if the node is not AND, this is not MUX
    if ( !Gia_ObjIsAnd(pNode) || Gia_ObjIsBuf(pNode) )
        return 0;
    // if the children are not complemented, this is not MUX
    if ( !Gia_ObjFaninC0(pNode) || !Gia_ObjFaninC1(pNode) )
        return 0;
    // get children
    pNode0 = Gia_ObjFanin0(pNode);
    pNode1 = Gia_ObjFanin1(pNode);
    // if the children are not ANDs, this is not MUX
    if ( !Gia_ObjIsAnd(pNode0) || !Gia_ObjIsAnd(pNode1) )
        return 0;
    // otherwise the node is MUX iff it has a pair of equal grandchildren
    return (Gia_ObjFanin0(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC0(pNode1))) || 
           (Gia_ObjFanin0(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC0(pNode0) ^ Gia_ObjFaninC1(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin0(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC0(pNode1))) ||
           (Gia_ObjFanin1(pNode0) == Gia_ObjFanin1(pNode1) && (Gia_ObjFaninC1(pNode0) ^ Gia_ObjFaninC1(pNode1)));
}